

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O2

int arkStep_NlsFPFunction_MassFixed_TrivialPredAutonomous(N_Vector zcor,N_Vector g,void *arkode_mem)

{
  int iVar1;
  int iVar2;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  int nls_iter;
  
  iVar1 = arkStep_AccessARKODEStepMem
                    (arkode_mem,"arkStep_NlsFPFunction_MassFixed_TrivialPredAutonomous",&ark_mem,
                     &step_mem);
  if (iVar1 == 0) {
    N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,step_mem->zpred,zcor,ark_mem->ycur);
    iVar1 = SUNNonlinSolGetCurIter(step_mem->NLS,&nls_iter);
    if (iVar1 == 0) {
      iVar1 = -8;
      if ((nls_iter == 0) && (step_mem->fn_implicit != (N_Vector)0x0)) {
        N_VScale(0x3ff0000000000000,step_mem->fn_implicit,step_mem->Fi[step_mem->istage]);
      }
      else {
        iVar2 = (*step_mem->nls_fi)(ark_mem->tcur,ark_mem->ycur,step_mem->Fi[step_mem->istage],
                                    ark_mem->user_data);
        step_mem->nfi = step_mem->nfi + 1;
        if (iVar2 < 0) {
          return -8;
        }
        if (iVar2 != 0) {
          return 9;
        }
      }
      N_VLinearSum(step_mem->gamma,0x3ff0000000000000,step_mem->Fi[step_mem->istage],step_mem->sdata
                   ,g);
      iVar2 = (*step_mem->msolve)(ark_mem,g,step_mem->nlscoef);
      if (-1 < iVar2) {
        iVar1 = (uint)(iVar2 != 0) + (uint)(iVar2 != 0) * 8;
      }
    }
    else {
      iVar1 = -0x20;
    }
  }
  return iVar1;
}

Assistant:

int arkStep_NlsFPFunction_MassFixed_TrivialPredAutonomous(N_Vector zcor,
                                                          N_Vector g,
                                                          void* arkode_mem)
{
  /* temporary variables */
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval, nls_iter;

  /* access ARKodeMem and ARKodeARKStepMem structures */
  retval = arkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* update 'ycur' value as stored predictor + current corrector */
  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, ark_mem->ycur);

  /* compute implicit RHS if not already available */
  retval = SUNNonlinSolGetCurIter(step_mem->NLS, &nls_iter);
  if (retval != ARK_SUCCESS) { return ARK_NLS_OP_ERR; }

  if (nls_iter == 0 && step_mem->fn_implicit)
  {
    N_VScale(ONE, step_mem->fn_implicit, step_mem->Fi[step_mem->istage]);
  }
  else
  {
    /* compute implicit RHS and save for later */
    retval = step_mem->nls_fi(ark_mem->tcur, ark_mem->ycur,
                              step_mem->Fi[step_mem->istage], ark_mem->user_data);
    step_mem->nfi++;
    if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
    if (retval > 0) { return (RHSFUNC_RECVR); }
  }

  /* combine parts:  g = gamma*Fi(z) + sdata */
  N_VLinearSum(step_mem->gamma, step_mem->Fi[step_mem->istage], ONE,
               step_mem->sdata, g);

  /* perform mass matrix solve */
  retval = step_mem->msolve((void*)ark_mem, g, step_mem->nlscoef);
  if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
  if (retval > 0) { return (RHSFUNC_RECVR); }

  return (ARK_SUCCESS);
}